

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

void __thiscall
dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor
          (CFGStructurizer *this,CFGNode *anchor,CFGNode *common_pdom,Vector<CFGNode_*> *constructs)

{
  CFGNode *pCVar1;
  bool bVar2;
  size_type sVar3;
  const_reference ppCVar4;
  reference ppCVar5;
  pointer pIVar6;
  bool local_232;
  bool local_231;
  value_type local_228;
  value_type local_218;
  undefined1 local_208 [8];
  PHI anchor_cond_phi;
  pointer local_1d0;
  size_t i_3;
  Id local_1c0;
  pointer local_1b8;
  size_t i_2;
  PHI outside_true_phi;
  ulong local_178;
  size_t i_1;
  Id local_168;
  size_type local_160;
  size_t i;
  PHI take_anchor_phi;
  size_t cutoff_path0;
  size_t cutoff_normal_path;
  Id local_118;
  value_type local_110;
  undefined1 local_100 [8];
  PHI terminator_selector;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_78;
  CFGNode *local_58;
  CFGNode *anchor_dispatcher;
  CFGNode *anchor_terminator;
  CFGNode *anchor_to_construct1;
  CFGNode *anchor_to_construct0;
  CFGNode *anchor_pred;
  Builder *builder;
  Vector<CFGNode_*> *constructs_local;
  CFGNode *common_pdom_local;
  CFGNode *anchor_local;
  CFGStructurizer *this_local;
  
  builder = (Builder *)constructs;
  constructs_local = (Vector<CFGNode_*> *)common_pdom;
  common_pdom_local = anchor;
  anchor_local = (CFGNode *)this;
  anchor_pred = (CFGNode *)SPIRVModule::get_builder(this->module);
  if ((common_pdom_local->ir).terminator.type != Condition) {
    __assert_fail("anchor->ir.terminator.type == Terminator::Type::Condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x16cf,
                  "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
                 );
  }
  sVar3 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          size((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
               builder);
  if (sVar3 != 2) {
    __assert_fail("constructs.size() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x16d0,
                  "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
                 );
  }
  ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        *)builder,0);
  bVar2 = CFGNode::post_dominates(*ppCVar4,(common_pdom_local->ir).terminator.true_block);
  local_231 = true;
  if (!bVar2) {
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,0);
    local_231 = CFGNode::post_dominates(*ppCVar4,(common_pdom_local->ir).terminator.false_block);
  }
  if (local_231 == false) {
    __assert_fail("constructs[0]->post_dominates(anchor->ir.terminator.true_block) || constructs[0]->post_dominates(anchor->ir.terminator.false_block)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x16d2,
                  "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
                 );
  }
  ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        *)builder,1);
  bVar2 = CFGNode::post_dominates(*ppCVar4,(common_pdom_local->ir).terminator.true_block);
  local_232 = true;
  if (!bVar2) {
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,1);
    local_232 = CFGNode::post_dominates(*ppCVar4,(common_pdom_local->ir).terminator.false_block);
  }
  if (local_232 != false) {
    anchor_to_construct0 = create_helper_pred_block(this,common_pdom_local);
    anchor_to_construct1 = CFGNodePool::create_node(this->pool);
    anchor_terminator = CFGNodePool::create_node(this->pool);
    anchor_dispatcher = CFGNodePool::create_node(this->pool);
    local_58 = CFGNodePool::create_node(this->pool);
    std::operator+(&local_78,&common_pdom_local->name,".anchor0");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::operator=(&anchor_to_construct1->name,&local_78);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::~basic_string(&local_78);
    std::operator+(&local_98,&common_pdom_local->name,".anchor1");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::operator=(&anchor_terminator->name,&local_98);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::~basic_string(&local_98);
    anchor_to_construct1->immediate_dominator = common_pdom_local;
    anchor_terminator->immediate_dominator = common_pdom_local;
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,0);
    anchor_to_construct1->immediate_post_dominator = *ppCVar4;
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,1);
    anchor_terminator->immediate_post_dominator = *ppCVar4;
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,0);
    anchor_to_construct1->forward_post_visit_order = (*ppCVar4)->forward_post_visit_order;
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,1);
    anchor_terminator->forward_post_visit_order = (*ppCVar4)->forward_post_visit_order;
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,0);
    anchor_to_construct1->backward_post_visit_order = (*ppCVar4)->backward_post_visit_order;
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,1);
    anchor_terminator->backward_post_visit_order = (*ppCVar4)->backward_post_visit_order;
    CFGNode::add_branch(anchor_to_construct1,anchor_dispatcher);
    CFGNode::add_branch(anchor_terminator,anchor_dispatcher);
    (anchor_to_construct1->ir).terminator.type = Branch;
    (anchor_to_construct1->ir).terminator.direct_block = anchor_dispatcher;
    (anchor_terminator->ir).terminator.type = Branch;
    (anchor_terminator->ir).terminator.direct_block = anchor_dispatcher;
    std::operator+(&local_b8,&common_pdom_local->name,".anchor-term");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::operator=(&anchor_dispatcher->name,&local_b8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::~basic_string(&local_b8);
    CFGNode::add_branch(anchor_dispatcher,local_58);
    (anchor_dispatcher->ir).terminator.type = Branch;
    (anchor_dispatcher->ir).terminator.direct_block = local_58;
    std::operator+((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)&terminator_selector.incoming.
                       super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&common_pdom_local->name,
                   ".anchor-dispatch");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::operator=(&local_58->name,
                (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *
                )&terminator_selector.incoming.
                  super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                     *)&terminator_selector.incoming.
                        super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    PHI::PHI((PHI *)local_100);
    local_100._0_4_ = SPIRVModule::allocate_id(this->module);
    local_100._4_4_ = spv::Builder::makeBoolType((Builder *)anchor_pred);
    local_110.block = anchor_to_construct1;
    local_110.id = spv::Builder::makeBoolConstant((Builder *)anchor_pred,true,false);
    std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>::
    push_back((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
               *)&terminator_selector.relaxed,&local_110);
    cutoff_normal_path = (size_t)anchor_terminator;
    local_118 = spv::Builder::makeBoolConstant((Builder *)anchor_pred,false,false);
    std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>::
    push_back((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
               *)&terminator_selector.relaxed,(value_type *)&cutoff_normal_path);
    pCVar1 = common_pdom_local;
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,0);
    traverse_dominated_blocks_and_rewrite_branch(this,pCVar1,*ppCVar4,anchor_to_construct1);
    pCVar1 = common_pdom_local;
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,1);
    traverse_dominated_blocks_and_rewrite_branch(this,pCVar1,*ppCVar4,anchor_terminator);
    local_178 = std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                size(&anchor_to_construct0->pred);
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,0);
    pCVar1 = (*ppCVar4)->immediate_dominator;
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,0);
    traverse_dominated_blocks_and_rewrite_branch(this,pCVar1,*ppCVar4,anchor_to_construct0);
    take_anchor_phi.incoming.
    super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::size(&anchor_to_construct0->pred);
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,1);
    pCVar1 = (*ppCVar4)->immediate_dominator;
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,1);
    traverse_dominated_blocks_and_rewrite_branch(this,pCVar1,*ppCVar4,anchor_to_construct0);
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,0);
    bVar2 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            empty(&(*ppCVar4)->pred);
    if (!bVar2) {
      __assert_fail("constructs[0]->pred.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0x1703,
                    "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
                   );
    }
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,1);
    bVar2 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            empty(&(*ppCVar4)->pred);
    if (bVar2) {
      PHI::PHI((PHI *)&i);
      i._0_4_ = SPIRVModule::allocate_id(this->module);
      i._4_4_ = spv::Builder::makeBoolType((Builder *)anchor_pred);
      for (local_160 = 0; local_160 < local_178; local_160 = local_160 + 1) {
        ppCVar5 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::operator[](&anchor_to_construct0->pred,local_160);
        i_1 = (size_t)*ppCVar5;
        local_168 = spv::Builder::makeBoolConstant((Builder *)anchor_pred,true,false);
        std::
        vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>::
        push_back((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                   *)&take_anchor_phi.relaxed,(value_type *)&i_1);
      }
      for (; sVar3 = std::
                     vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ::size(&anchor_to_construct0->pred), local_178 < sVar3;
          local_178 = local_178 + 1) {
        ppCVar5 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::operator[](&anchor_to_construct0->pred,local_178);
        outside_true_phi.incoming.
        super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppCVar5;
        spv::Builder::makeBoolConstant((Builder *)anchor_pred,false,false);
        std::
        vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>::
        push_back((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                   *)&take_anchor_phi.relaxed,
                  (value_type *)
                  &outside_true_phi.incoming.
                   super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      CFGNode::add_branch(anchor_to_construct0,common_pdom_local);
      CFGNode::add_branch(anchor_to_construct0,local_58);
      (anchor_to_construct0->ir).terminator.type = Condition;
      (anchor_to_construct0->ir).terminator.true_block = common_pdom_local;
      (anchor_to_construct0->ir).terminator.false_block = local_58;
      (anchor_to_construct0->ir).terminator.direct_block = (CFGNode *)0x0;
      (anchor_to_construct0->ir).terminator.conditional_id = (uint32_t)i;
      PHI::PHI((PHI *)&i_2);
      i_2._0_4_ = SPIRVModule::allocate_id(this->module);
      i_2._4_4_ = spv::Builder::makeBoolType((Builder *)anchor_pred);
      for (local_1b8 = (pointer)0x0;
          local_1b8 <
          take_anchor_phi.incoming.
          super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_1b8 = (pointer)((long)&local_1b8->block + 1)) {
        ppCVar5 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::operator[](&anchor_to_construct0->pred,(size_type)local_1b8);
        i_3 = (size_t)*ppCVar5;
        local_1c0 = spv::Builder::makeBoolConstant((Builder *)anchor_pred,true,false);
        std::
        vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>::
        push_back((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                   *)&outside_true_phi.relaxed,(value_type *)&i_3);
      }
      for (local_1d0 = take_anchor_phi.incoming.
                       super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pIVar6 = (pointer)std::
                            vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            ::size(&anchor_to_construct0->pred), local_1d0 < pIVar6;
          local_1d0 = (pointer)((long)&local_1d0->block + 1)) {
        ppCVar5 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::operator[](&anchor_to_construct0->pred,(size_type)local_1d0);
        anchor_cond_phi.incoming.
        super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppCVar5;
        spv::Builder::makeBoolConstant((Builder *)anchor_pred,false,false);
        std::
        vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>::
        push_back((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                   *)&outside_true_phi.relaxed,
                  (value_type *)
                  &anchor_cond_phi.incoming.
                   super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      PHI::PHI((PHI *)local_208);
      local_208._0_4_ = SPIRVModule::allocate_id(this->module);
      local_208._4_4_ = spv::Builder::makeBoolType((Builder *)anchor_pred);
      local_218.block = common_pdom_local;
      local_218.id = local_100._0_4_;
      std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ::push_back((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                   *)&anchor_cond_phi.relaxed,&local_218);
      local_228.block = anchor_to_construct0;
      local_228.id = (uint32_t)i_2;
      std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ::push_back((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                   *)&anchor_cond_phi.relaxed,&local_228);
      std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::push_back
                (&(anchor_to_construct0->ir).phi,(value_type *)&i);
      std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::push_back
                (&(anchor_to_construct0->ir).phi,(value_type *)&i_2);
      std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::push_back
                (&(anchor_dispatcher->ir).phi,(value_type *)local_100);
      (local_58->ir).terminator.conditional_id = local_208._0_4_;
      (local_58->ir).terminator.type = Condition;
      ppCVar4 = std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,0);
      (local_58->ir).terminator.true_block = *ppCVar4;
      ppCVar4 = std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,1);
      pCVar1 = local_58;
      (local_58->ir).terminator.false_block = *ppCVar4;
      ppCVar4 = std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,0);
      CFGNode::add_branch(pCVar1,*ppCVar4);
      pCVar1 = local_58;
      ppCVar4 = std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)builder,1);
      CFGNode::add_branch(pCVar1,*ppCVar4);
      std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::push_back
                (&(local_58->ir).phi,(value_type *)local_208);
      PHI::~PHI((PHI *)local_208);
      PHI::~PHI((PHI *)&i_2);
      PHI::~PHI((PHI *)&i);
      PHI::~PHI((PHI *)local_100);
      return;
    }
    __assert_fail("constructs[1]->pred.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x1704,
                  "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
                 );
  }
  __assert_fail("constructs[1]->post_dominates(anchor->ir.terminator.true_block) || constructs[1]->post_dominates(anchor->ir.terminator.false_block)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                ,0x16d4,
                "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
               );
}

Assistant:

void CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(
	CFGNode *anchor, CFGNode *common_pdom, const Vector<CFGNode *> &constructs)
{
	auto &builder = module.get_builder();

	// If we have an anchor, it should collect all control flow, maybe dispatch itself, then dispatch to the constructs.
	// It must be a conditional branch, since it's too much of a mess to deal with switch.
	assert(anchor->ir.terminator.type == Terminator::Type::Condition);
	assert(constructs.size() == 2);
	assert(constructs[0]->post_dominates(anchor->ir.terminator.true_block) ||
	       constructs[0]->post_dominates(anchor->ir.terminator.false_block));
	assert(constructs[1]->post_dominates(anchor->ir.terminator.true_block) ||
	       constructs[1]->post_dominates(anchor->ir.terminator.false_block));

	auto *anchor_pred = create_helper_pred_block(anchor);

	auto *anchor_to_construct0 = pool.create_node();
	auto *anchor_to_construct1 = pool.create_node();
	auto *anchor_terminator = pool.create_node();
	auto *anchor_dispatcher = pool.create_node();

	anchor_to_construct0->name = anchor->name + ".anchor0";
	anchor_to_construct1->name = anchor->name + ".anchor1";

	anchor_to_construct0->immediate_dominator = anchor;
	anchor_to_construct1->immediate_dominator = anchor;
	anchor_to_construct0->immediate_post_dominator = constructs[0];
	anchor_to_construct1->immediate_post_dominator = constructs[1];
	anchor_to_construct0->forward_post_visit_order = constructs[0]->forward_post_visit_order;
	anchor_to_construct1->forward_post_visit_order = constructs[1]->forward_post_visit_order;
	anchor_to_construct0->backward_post_visit_order = constructs[0]->backward_post_visit_order;
	anchor_to_construct1->backward_post_visit_order = constructs[1]->backward_post_visit_order;

	anchor_to_construct0->add_branch(anchor_terminator);
	anchor_to_construct1->add_branch(anchor_terminator);
	anchor_to_construct0->ir.terminator.type = Terminator::Type::Branch;
	anchor_to_construct0->ir.terminator.direct_block = anchor_terminator;
	anchor_to_construct1->ir.terminator.type = Terminator::Type::Branch;
	anchor_to_construct1->ir.terminator.direct_block = anchor_terminator;
	anchor_terminator->name = anchor->name + ".anchor-term";
	anchor_terminator->add_branch(anchor_dispatcher);
	anchor_terminator->ir.terminator.type = Terminator::Type::Branch;
	anchor_terminator->ir.terminator.direct_block = anchor_dispatcher;
	anchor_dispatcher->name = anchor->name + ".anchor-dispatch";

	PHI terminator_selector;
	terminator_selector.id = module.allocate_id();
	terminator_selector.type_id = builder.makeBoolType();
	terminator_selector.incoming.push_back({ anchor_to_construct0, builder.makeBoolConstant(true) });
	terminator_selector.incoming.push_back({ anchor_to_construct1, builder.makeBoolConstant(false) });

	traverse_dominated_blocks_and_rewrite_branch(anchor, constructs[0], anchor_to_construct0);
	traverse_dominated_blocks_and_rewrite_branch(anchor, constructs[1], anchor_to_construct1);

	size_t cutoff_normal_path = anchor_pred->pred.size();
	traverse_dominated_blocks_and_rewrite_branch(constructs[0]->immediate_dominator, constructs[0], anchor_pred);
	size_t cutoff_path0 = anchor_pred->pred.size();
	traverse_dominated_blocks_and_rewrite_branch(constructs[1]->immediate_dominator, constructs[1], anchor_pred);

	assert(constructs[0]->pred.empty());
	assert(constructs[1]->pred.empty());

	// Branch to anchor as normal if we have a pre-existing pred.
	PHI take_anchor_phi;
	take_anchor_phi.id = module.allocate_id();
	take_anchor_phi.type_id = builder.makeBoolType();
	for (size_t i = 0; i < cutoff_normal_path; i++)
		take_anchor_phi.incoming.push_back({ anchor_pred->pred[i], builder.makeBoolConstant(true) });
	for (size_t i = cutoff_normal_path; i < anchor_pred->pred.size(); i++)
		take_anchor_phi.incoming.push_back({ anchor_pred->pred[i], builder.makeBoolConstant(false) });

	anchor_pred->add_branch(anchor);
	anchor_pred->add_branch(anchor_dispatcher);
	anchor_pred->ir.terminator.type = Terminator::Type::Condition;
	anchor_pred->ir.terminator.true_block = anchor;
	anchor_pred->ir.terminator.false_block = anchor_dispatcher;
	anchor_pred->ir.terminator.direct_block = nullptr;
	anchor_pred->ir.terminator.conditional_id = take_anchor_phi.id;

	PHI outside_true_phi;
	outside_true_phi.id = module.allocate_id();
	outside_true_phi.type_id = builder.makeBoolType();
	for (size_t i = 0; i < cutoff_path0; i++)
		outside_true_phi.incoming.push_back({ anchor_pred->pred[i], builder.makeBoolConstant(true) });
	for (size_t i = cutoff_path0; i < anchor_pred->pred.size(); i++)
		outside_true_phi.incoming.push_back({ anchor_pred->pred[i], builder.makeBoolConstant(false) });

	PHI anchor_cond_phi;
	anchor_cond_phi.id = module.allocate_id();
	anchor_cond_phi.type_id = builder.makeBoolType();
	// If we took the path through anchor, use that conditional. Otherwise, use the selector between path 0 or 1.
	anchor_cond_phi.incoming.push_back({ anchor, terminator_selector.id });
	anchor_cond_phi.incoming.push_back({ anchor_pred, outside_true_phi.id });

	anchor_pred->ir.phi.push_back(std::move(take_anchor_phi));
	anchor_pred->ir.phi.push_back(std::move(outside_true_phi));
	anchor_terminator->ir.phi.push_back(std::move(terminator_selector));
	anchor_dispatcher->ir.terminator.conditional_id = anchor_cond_phi.id;
	anchor_dispatcher->ir.terminator.type = Terminator::Type::Condition;
	anchor_dispatcher->ir.terminator.true_block = constructs[0];
	anchor_dispatcher->ir.terminator.false_block = constructs[1];
	anchor_dispatcher->add_branch(constructs[0]);
	anchor_dispatcher->add_branch(constructs[1]);
	anchor_dispatcher->ir.phi.push_back(std::move(anchor_cond_phi));
}